

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O3

int coda_cursor_get_byte_size(coda_cursor *cursor,int64_t *byte_size)

{
  int iVar1;
  int iVar2;
  int64_t bit_size;
  ulong local_10;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n - 1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x681);
    iVar2 = -1;
  }
  else {
    iVar1 = coda_cursor_get_bit_size(cursor,(int64_t *)&local_10);
    iVar2 = -1;
    if (iVar1 == 0) {
      if ((long)local_10 < 0) {
        *byte_size = -1;
      }
      else {
        *byte_size = ((local_10 >> 3) + 1) - (ulong)((local_10 & 7) == 0);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

LIBCODA_API int coda_cursor_get_byte_size(const coda_cursor *cursor, int64_t *byte_size)
{
    int64_t bit_size;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
    {
        return -1;
    }
    if (bit_size < 0)
    {
        *byte_size = -1;
        return 0;
    }

    /* round up to the nearest byte */
    *byte_size = (bit_size >> 3) + ((bit_size & 0x7) != 0 ? 1 : 0);

    return 0;
}